

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

vec4 __thiscall CEditor::GetButtonColor(CEditor *this,void *pID,int Checked)

{
  CUI *pCVar1;
  void *pvVar2;
  int in_EDX;
  void *in_RSI;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  vec4 vVar3;
  vector4_base<float> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX < 0) {
    vector4_base<float>::vector4_base(&local_18,0.0,0.0,0.0,0.5);
  }
  else if (in_EDX < 1) {
    pCVar1 = UI(in_RDI);
    pvVar2 = CUI::HotItem(pCVar1);
    if (pvVar2 == in_RSI) {
      vector4_base<float>::vector4_base(&local_18,1.0,1.0,1.0,0.75);
    }
    else {
      vector4_base<float>::vector4_base(&local_18,1.0,1.0,1.0,0.5);
    }
  }
  else {
    pCVar1 = UI(in_RDI);
    pvVar2 = CUI::HotItem(pCVar1);
    if (pvVar2 == in_RSI) {
      vector4_base<float>::vector4_base(&local_18,1.0,0.0,0.0,0.75);
    }
    else {
      vector4_base<float>::vector4_base(&local_18,1.0,0.0,0.0,0.5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    vVar3.field_2 = local_18.field_2;
    vVar3.field_3 = local_18.field_3;
    vVar3.field_0 = local_18.field_0;
    vVar3.field_1 = local_18.field_1;
    return vVar3;
  }
  __stack_chk_fail();
}

Assistant:

vec4 CEditor::GetButtonColor(const void *pID, int Checked)
{
	if(Checked < 0)
		return vec4(0,0,0,0.5f);

	if(Checked > 0)
	{
		if(UI()->HotItem() == pID)
			return vec4(1,0,0,0.75f);
		return vec4(1,0,0,0.5f);
	}

	if(UI()->HotItem() == pID)
		return vec4(1,1,1,0.75f);
	return vec4(1,1,1,0.5f);
}